

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

Matrix4d * math::view(Matrix4d *__return_storage_ptr__,Tuple4d *from,Tuple4d *to,Tuple4d *up)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  int i;
  size_t sVar5;
  int i_1;
  Tuple4d true_up;
  Tuple4d forward;
  Matrix4d ret;
  Tuple4d left;
  Tuple4d local_288;
  Tuple4d local_268;
  Matrix4d local_248;
  Tuple4d local_1c8;
  Matrix4d local_1a8;
  Matrix4d local_128;
  Matrix4d local_a8;
  
  operator-(to,from);
  Tuple4d::normalize(&local_268,(Tuple4d *)&local_1a8);
  Tuple4d::normalize((Tuple4d *)&local_1a8,up);
  cross(&local_268,(Tuple4d *)&local_1a8);
  cross(&local_1c8,&local_268);
  identity();
  sVar5 = 0;
  do {
    pdVar4 = Tuple4d::operator()(&local_1c8,sVar5);
    local_248.m_buffer[0][sVar5] = *pdVar4;
    sVar5 = sVar5 + 1;
  } while (sVar5 != 3);
  sVar5 = 0;
  do {
    pdVar4 = Tuple4d::operator()(&local_288,sVar5);
    (&local_1c8)[-3].m_buffer[sVar5] = *pdVar4;
    sVar5 = sVar5 + 1;
  } while (sVar5 != 3);
  sVar5 = 0;
  do {
    pdVar4 = Tuple4d::operator()(&local_268,sVar5);
    (&local_1c8)[-2].m_buffer[sVar5] = -*pdVar4;
    sVar5 = sVar5 + 1;
  } while (sVar5 != 3);
  identity();
  pdVar4 = Tuple4d::operator()(from,0);
  dVar1 = *pdVar4;
  pdVar4 = Tuple4d::operator()(from,1);
  dVar2 = *pdVar4;
  pdVar4 = Tuple4d::operator()(from,2);
  dVar3 = *pdVar4;
  identity();
  local_1a8.m_buffer[0][3] = -dVar1;
  local_1a8.m_buffer[1][3] = -dVar2;
  local_1a8.m_buffer[2][3] = -dVar3;
  operator*(&local_a8,&local_1a8,&local_128);
  operator*(__return_storage_ptr__,&local_248,&local_a8);
  return __return_storage_ptr__;
}

Assistant:

math::Matrix4d math::view(const math::Tuple4d &from, const math::Tuple4d &to, const math::Tuple4d &up)
{
    math::Tuple4d forward = (to - from).normalize();
    math::Tuple4d left = cross(forward, up.normalize());
    math::Tuple4d true_up = cross(left, forward);

    math::Matrix4d ret{identity()};

    for (int i = 0; i < 3; i++)
    {
	ret(0, i) = left(i);
    }

    for (int i = 0; i < 3; i++)
    {
	ret(1, i) = true_up(i);
    }

    for (int i = 0; i < 3; i++)
    {
	ret(2, i) = -forward(i);
    }

    return (ret * identity().translate(-from(0), -from(1), -from(2)));
}